

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O3

BadStatusOrAccess * __thiscall
absl::BadStatusOrAccess::operator=(BadStatusOrAccess *this,BadStatusOrAccess *other)

{
  StatusRep *this_00;
  StatusRep *pSVar1;
  anon_class_8_1_8991fb9c *in_RDX;
  BadStatusOrAccess *local_18;
  
  local_18 = other;
  if ((other->init_what_).control_.super___atomic_base<unsigned_int>._M_i != 0xdd) {
    base_internal::CallOnceImpl<absl::BadStatusOrAccess::InitWhat()const::__0>
              (&(other->init_what_).control_,(SchedulingMode)&local_18,in_RDX);
  }
  this_00 = (StatusRep *)(this->status_).rep_;
  pSVar1 = (StatusRep *)(other->status_).rep_;
  if (pSVar1 != this_00) {
    if (((ulong)pSVar1 & 1) == 0) {
      LOCK();
      (pSVar1->ref_).super___atomic_base<int>._M_i =
           (pSVar1->ref_).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pSVar1 = (StatusRep *)(other->status_).rep_;
    }
    (this->status_).rep_ = (uintptr_t)pSVar1;
    if (((ulong)this_00 & 1) == 0) {
      status_internal::StatusRep::Unref(this_00);
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->what_);
  return this;
}

Assistant:

BadStatusOrAccess& BadStatusOrAccess::operator=(
    const BadStatusOrAccess& other) {
  // Ensure assignment is correct regardless of whether this->InitWhat() has
  // already been called.
  other.InitWhat();
  status_ = other.status_;
  what_ = other.what_;
  return *this;
}